

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

void strpool_internal_expand_entries(strpool_t *pool)

{
  strpool_internal_entry_t *__dest;
  strpool_internal_entry_t *new_entries;
  strpool_t *pool_local;
  
  pool->entry_capacity = pool->entry_capacity << 1;
  __dest = (strpool_internal_entry_t *)malloc((long)pool->entry_capacity << 5);
  if (__dest == (strpool_internal_entry_t *)0x0) {
    __assert_fail("( new_entries ) && ( \"Allocation failed\" )",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                  ,0x363,"void strpool_internal_expand_entries(strpool_t *)");
  }
  memcpy(__dest,pool->entries,(long)pool->entry_count << 5);
  free(pool->entries);
  pool->entries = __dest;
  return;
}

Assistant:

static void strpool_internal_expand_entries( strpool_t* pool )
    {
    pool->entry_capacity *= 2;
    strpool_internal_entry_t* new_entries = (strpool_internal_entry_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->entry_capacity * sizeof( *pool->entries ) );
    STRPOOL_ASSERT( new_entries, "Allocation failed" );
    STRPOOL_MEMCPY( new_entries, pool->entries, pool->entry_count * sizeof( *pool->entries ) );
    STRPOOL_FREE( pool->memctx, pool->entries );
    pool->entries = new_entries;    
    }